

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cc
# Opt level: O3

void __thiscall xLearn::InmemReader::init_from_txt(InmemReader *this)

{
  undefined1 auVar1 [64];
  bool label;
  uint uVar2;
  pointer puVar3;
  pointer pcVar4;
  char *pcVar5;
  long lVar6;
  string *filename;
  Parser *pPVar7;
  FILE *__stream;
  size_t sVar8;
  uint64_t uVar9;
  uint64_t uVar10;
  ulong uVar11;
  long lVar12;
  size_t len;
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  string bin_file;
  string local_58;
  string *local_38;
  
  Reader::check_file_format_abi_cxx11_(&local_58,&this->super_Reader);
  pPVar7 = Reader::CreateParser(&this->super_Reader,local_58._M_dataplus._M_p);
  (this->super_Reader).parser_ = pPVar7;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  pPVar7 = (this->super_Reader).parser_;
  pPVar7->has_label_ = (this->super_Reader).has_label_;
  std::__cxx11::string::_M_assign((string *)&pPVar7->splitor_);
  local_38 = &(this->super_Reader).filename_;
  len = (this->super_Reader).block_size_ * 0x100000;
  __stream = (FILE *)OpenFileOrDie((this->super_Reader).filename_._M_dataplus._M_p,"r");
  sVar8 = ReadDataFromDisk((FILE *)__stream,(this->super_Reader).block_,len);
  if (sVar8 != 0) {
    do {
      if (sVar8 == len) {
        lVar12 = 1;
        sVar8 = len + 1;
        do {
          lVar12 = lVar12 + -1;
          lVar6 = sVar8 - 2;
          sVar8 = sVar8 - 1;
        } while ((this->super_Reader).block_[lVar6] != '\n');
        fseek(__stream,lVar12,1);
      }
      pPVar7 = (this->super_Reader).parser_;
      (*pPVar7->_vptr_Parser[2])(pPVar7,(this->super_Reader).block_,sVar8,&this->data_buf_,0);
      sVar8 = ReadDataFromDisk((FILE *)__stream,(this->super_Reader).block_,len);
    } while (sVar8 != 0);
  }
  filename = local_38;
  uVar9 = HashFile(local_38,true);
  uVar10 = HashFile(filename,false);
  (this->data_buf_).hash_value_1 = uVar9;
  (this->data_buf_).hash_value_2 = uVar10;
  label = (this->super_Reader).has_label_;
  (this->data_buf_).has_label = label;
  uVar2 = (this->data_buf_).row_length;
  this->num_samples_ = uVar2;
  DMatrix::ReAlloc(&(this->super_Reader).data_samples_,(ulong)uVar2,label);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&this->order_,(ulong)this->num_samples_);
  puVar3 = (this->order_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar12 = (long)(this->order_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar3;
  if (lVar12 != 0) {
    auVar13 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar14 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar15 = vpmovsxbd_avx512f(_DAT_0015a560);
    auVar16 = vpbroadcastq_avx512f(ZEXT816(0x10));
    auVar17 = vpbroadcastd_avx512f(ZEXT416(0x10));
    lVar12 = lVar12 >> 2;
    auVar18 = vpbroadcastq_avx512f();
    uVar11 = 0;
    do {
      vpcmpuq_avx512f(auVar14,auVar18,2);
      vpcmpuq_avx512f(auVar13,auVar18,2);
      auVar14 = vpaddq_avx512f(auVar14,auVar16);
      auVar13 = vpaddq_avx512f(auVar13,auVar16);
      auVar1 = vmovdqu32_avx512f(auVar15);
      *(undefined1 (*) [64])(puVar3 + uVar11) = auVar1;
      uVar11 = uVar11 + 0x10;
      auVar15 = vpaddd_avx512f(auVar15,auVar17);
    } while ((lVar12 + (ulong)(lVar12 == 0) + 0xf & 0xfffffffffffffff0) != uVar11);
  }
  if ((this->super_Reader).bin_out_ == true) {
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    pcVar4 = (this->super_Reader).filename_._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_58,pcVar4,pcVar4 + (this->super_Reader).filename_._M_string_length);
    std::__cxx11::string::append((char *)&local_58);
    DMatrix::Serialize(&this->data_buf_,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
  }
  pcVar5 = (this->super_Reader).block_;
  if (pcVar5 != (char *)0x0) {
    operator_delete__(pcVar5);
  }
  Close((FILE *)__stream);
  return;
}

Assistant:

void InmemReader::init_from_txt() {
  // Init parser_                       
  parser_ = CreateParser(check_file_format().c_str());
  if (has_label_) parser_->setLabel(true);
  else parser_->setLabel(false);
  // Set splitor
  parser_->setSplitor(this->splitor_);
  // Convert MB to Byte
  uint64 read_byte = block_size_ * 1024 * 1024;
  // Open file
#ifndef _MSC_VER
  FILE* file = OpenFileOrDie(filename_.c_str(), "r");
#else
  FILE* file = OpenFileOrDie(filename_.c_str(), "rb");
#endif
  // Read until the end of file
  for (;;) {
    // Read a block of data from disk file
    size_t ret = ReadDataFromDisk(file, block_, read_byte);
    if (ret == 0) {
      break;
    } else if (ret == read_byte) {
      // Find the last '\n', and shrink back file pointer
      this->shrink_block(block_, &ret, file);
    } // else ret < read_byte: we don't need shrink_block()
    parser_->Parse(block_, ret, data_buf_, false);
  }
  data_buf_.SetHash(HashFile(filename_, true),
                    HashFile(filename_, false));
  data_buf_.has_label = has_label_;
  // Init data_samples_ 
  num_samples_ = data_buf_.row_length;
  data_samples_.ReAlloc(num_samples_, has_label_);
  // for shuffle
  order_.resize(num_samples_);
  for (int i = 0; i < order_.size(); ++i) {
    order_[i] = i;
  }
  // Deserialize in-memory buffer to disk file.
  if (bin_out_) {
    std::string bin_file = filename_ + ".bin";
    data_buf_.Serialize(bin_file);
  }
  delete [] block_;
  Close(file);
}